

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::MethodDescriptorProto::MergePartialFromCodedStream
          (MethodDescriptorProto *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  string *psVar5;
  char *pcVar6;
  MethodOptions *value;
  UnknownFieldSet *unknown_fields;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  MethodDescriptorProto *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
LAB_005259ab:
  do {
    kMax1ByteVarint = 0x7f;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if ((input->buffer_ < input->buffer_end_) &&
       (tag_2 = (uint32)*input->buffer_, '\0' < (char)*input->buffer_)) {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*input->buffer_;
      io::CodedInputStream::Advance(input,1);
      local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_89;
      pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    else {
      local_3c[0] = io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c[0] - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    tag_00 = local_10;
    if ((uStack_c & 1) == 0) goto switchD_00525bc2_default;
    iVar2 = internal::WireFormatLite::GetTagFieldNumber(local_10);
    switch(iVar2) {
    case 1:
      if ((tag_00 & 0xff) == 10) {
        psVar5 = mutable_name_abi_cxx11_(this);
        bVar1 = internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        name_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        name_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar6,iVar2,PARSE,"google.protobuf.MethodDescriptorProto.name");
        goto LAB_005259ab;
      }
      break;
    case 2:
      if ((tag_00 & 0xff) == 0x12) {
        psVar5 = mutable_input_type_abi_cxx11_(this);
        bVar1 = internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        input_type_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        input_type_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar6,iVar2,PARSE,"google.protobuf.MethodDescriptorProto.input_type");
        goto LAB_005259ab;
      }
      break;
    case 3:
      if ((tag_00 & 0xff) == 0x1a) {
        psVar5 = mutable_output_type_abi_cxx11_(this);
        bVar1 = internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        output_type_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        output_type_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar6,iVar2,PARSE,"google.protobuf.MethodDescriptorProto.output_type");
        goto LAB_005259ab;
      }
      break;
    case 4:
      if ((tag_00 & 0xff) != 0x22) break;
      value = mutable_options(this);
      bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::MethodOptions>
                        (input,value);
      goto joined_r0x00525e03;
    case 5:
      if ((tag_00 & 0xff) == 0x28) {
        set_has_client_streaming(this);
        bVar1 = internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&this->client_streaming_);
        goto joined_r0x00525e03;
      }
      break;
    case 6:
      if ((tag_00 & 0xff) == 0x30) {
        set_has_server_streaming(this);
        bVar1 = internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&this->server_streaming_);
        goto joined_r0x00525e03;
      }
    }
switchD_00525bc2_default:
    if ((tag_00 == 0) ||
       (WVar3 = internal::WireFormatLite::GetTagWireType(tag_00), WVar3 == WIRETYPE_END_GROUP)) {
      return true;
    }
    unknown_fields = mutable_unknown_fields(this);
    bVar1 = internal::WireFormat::SkipField(input,tag_00,unknown_fields);
joined_r0x00525e03:
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool MethodDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.MethodDescriptorProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.MethodDescriptorProto.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string input_type = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_input_type()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->input_type().data(), this->input_type().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.MethodDescriptorProto.input_type");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string output_type = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_output_type()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->output_type().data(), this->output_type().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.MethodDescriptorProto.output_type");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.MethodOptions options = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool client_streaming = 5 [default = false];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_client_streaming();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &client_streaming_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool server_streaming = 6 [default = false];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          set_has_server_streaming();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &server_streaming_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.MethodDescriptorProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.MethodDescriptorProto)
  return false;
#undef DO_
}